

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O1

void __thiscall GLEEHorizonPortal::DrawContents(GLEEHorizonPortal *this)

{
  sector_t *this_00;
  FDynamicColormap *pFVar1;
  int iVar2;
  int iVar3;
  GLSkyInfo skyinfo;
  GLHorizonPortal ceil;
  GLHorizonInfo local_140;
  GLHorizonPortal local_e0;
  
  this_00 = this->portal->mOrigin;
  if ((this_00->planes[0].Texture.texnum == skyflatnum.texnum) ||
     (this_00->planes[1].Texture.texnum == skyflatnum.texnum)) {
    GLSkyInfo::init((GLSkyInfo *)&local_140,(EVP_PKEY_CTX *)(ulong)(uint)this_00->sky);
    local_e0.super_GLPortal.lines.Array = (GLWall *)0x0;
    local_e0.super_GLPortal.lines.Most = 0;
    local_e0.super_GLPortal.lines.Count = 0;
    local_e0.super_GLPortal.mPrimIndices.Array = (uint *)0x0;
    local_e0.super_GLPortal.mPrimIndices.Most = 0;
    local_e0.super_GLPortal.mPrimIndices.Count = 0;
    local_e0.super_GLPortal.savedmapsection.Array = (uchar *)0x0;
    local_e0.super_GLPortal.savedmapsection.Most = 0;
    local_e0.super_GLPortal.savedmapsection.Count = 0;
    local_e0.super_GLPortal._vptr_GLPortal = (_func_int **)&PTR__GLPortal_00843168;
    local_e0.origin = &local_140;
    GLSkyPortal::DrawContents((GLSkyPortal *)&local_e0);
    GLPortal::~GLPortal(&local_e0.super_GLPortal);
  }
  local_140.plane.texture.texnum = this_00->planes[1].Texture.texnum;
  if (local_140.plane.texture.texnum != skyflatnum.texnum) {
    local_140.plane.Offs.X = (float)this_00->planes[1].xform.xOffs;
    local_140.plane.Offs.Y =
         (float)(this_00->planes[1].xform.baseyOffs + this_00->planes[1].xform.yOffs);
    local_140.plane.Scale.X = (float)this_00->planes[1].xform.xScale;
    local_140.plane.Scale.Y = (float)this_00->planes[1].xform.yScale;
    local_140.plane.Angle =
         (float)(this_00->planes[1].xform.Angle.Degrees + this_00->planes[1].xform.baseAngle.Degrees
                );
    local_140.plane.plane.normal.Z = (this_00->ceilingplane).normal.Z;
    local_140.plane.plane.normal.Y = (this_00->ceilingplane).normal.Y;
    local_140.plane.plane.normal.X = (this_00->ceilingplane).normal.X;
    local_140.plane.plane.D = (this_00->ceilingplane).D;
    local_140.plane.plane.negiC = (this_00->ceilingplane).negiC;
    local_140.plane.Texheight = (float)local_140.plane.plane.D;
    iVar2 = sector_t::GetCeilingLight(this_00);
    iVar3 = 0xff;
    if (iVar2 < 0xff) {
      iVar3 = iVar2;
    }
    local_140.lightlevel = 0;
    if (0 < iVar3) {
      local_140.lightlevel = iVar3;
    }
    pFVar1 = this_00->ColorMap;
    local_140.colormap.LightColor.field_0 = (pFVar1->Color).field_0;
    local_140.colormap.desaturation = pFVar1->Desaturate;
    local_140.colormap.FadeColor.field_0 = (pFVar1->Fade).field_0;
    local_140.colormap.blendfactor = (int)(pFVar1->Color).field_0.field_0.a;
    if (this->portal->mType == 4) {
      local_140.plane.Texheight = (float)((double)ABS(local_140.plane.Texheight) + ViewPos.Z);
    }
    GLHorizonPortal::GLHorizonPortal(&local_e0,&local_140,true);
    GLHorizonPortal::DrawContents(&local_e0);
    GLPortal::~GLPortal(&local_e0.super_GLPortal);
  }
  if (this_00->planes[0].Texture.texnum != skyflatnum.texnum) {
    local_140.plane.Offs.X = (float)this_00->planes[0].xform.xOffs;
    local_140.plane.Offs.Y =
         (float)(this_00->planes[0].xform.baseyOffs + this_00->planes[0].xform.yOffs);
    local_140.plane.Scale.X = (float)this_00->planes[0].xform.xScale;
    local_140.plane.Scale.Y = (float)this_00->planes[0].xform.yScale;
    local_140.plane.Angle =
         (float)(this_00->planes[0].xform.Angle.Degrees + this_00->planes[0].xform.baseAngle.Degrees
                );
    local_140.plane.texture.texnum = this_00->planes[0].Texture.texnum;
    local_140.plane.plane.normal.Z = (this_00->floorplane).normal.Z;
    local_140.plane.plane.normal.Y = (this_00->floorplane).normal.Y;
    local_140.plane.plane.normal.X = (this_00->floorplane).normal.X;
    local_140.plane.plane.D = (this_00->floorplane).D;
    local_140.plane.plane.negiC = (this_00->floorplane).negiC;
    local_140.plane.Texheight = -(float)local_140.plane.plane.D;
    iVar2 = sector_t::GetFloorLight(this_00);
    iVar3 = 0xff;
    if (iVar2 < 0xff) {
      iVar3 = iVar2;
    }
    local_140.lightlevel = 0;
    if (0 < iVar3) {
      local_140.lightlevel = iVar3;
    }
    pFVar1 = this_00->ColorMap;
    local_140.colormap.LightColor.field_0 = (pFVar1->Color).field_0;
    local_140.colormap.desaturation = pFVar1->Desaturate;
    local_140.colormap.FadeColor.field_0 = (pFVar1->Fade).field_0;
    local_140.colormap.blendfactor = (int)(pFVar1->Color).field_0.field_0.a;
    if (this->portal->mType == 4) {
      local_140.plane.Texheight = (float)(ViewPos.Z - (double)ABS(local_140.plane.Texheight));
    }
    GLHorizonPortal::GLHorizonPortal(&local_e0,&local_140,true);
    GLHorizonPortal::DrawContents(&local_e0);
    GLPortal::~GLPortal(&local_e0.super_GLPortal);
  }
  return;
}

Assistant:

void GLEEHorizonPortal::DrawContents()
{
	PortalAll.Clock();
	sector_t *sector = portal->mOrigin;
	if (sector->GetTexture(sector_t::floor) == skyflatnum ||
		sector->GetTexture(sector_t::ceiling) == skyflatnum)
	{
		GLSkyInfo skyinfo;
		skyinfo.init(sector->sky, 0);
		GLSkyPortal sky(&skyinfo, true);
		sky.DrawContents();
	}
	if (sector->GetTexture(sector_t::ceiling) != skyflatnum)
	{
		GLHorizonInfo horz;
		horz.plane.GetFromSector(sector, true);
		horz.lightlevel = gl_ClampLight(sector->GetCeilingLight());
		horz.colormap = sector->ColorMap;
		if (portal->mType == PORTS_PLANE)
		{
			horz.plane.Texheight = ViewPos.Z + fabs(horz.plane.Texheight);
		}
		GLHorizonPortal ceil(&horz, true);
		ceil.DrawContents();
	}
	if (sector->GetTexture(sector_t::floor) != skyflatnum)
	{
		GLHorizonInfo horz;
		horz.plane.GetFromSector(sector, false);
		horz.lightlevel = gl_ClampLight(sector->GetFloorLight());
		horz.colormap = sector->ColorMap;
		if (portal->mType == PORTS_PLANE)
		{
			horz.plane.Texheight = ViewPos.Z - fabs(horz.plane.Texheight);
		}
		GLHorizonPortal floor(&horz, true);
		floor.DrawContents();
	}



}